

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<float> __thiscall wasm::WATParser::Lexer::takeF32(Lexer *this)

{
  undefined8 uVar1;
  ulong uVar2;
  float fVar3;
  float extraout_XMM0_Da;
  string_view sVar4;
  undefined1 local_50 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> result;
  
  sVar4 = next(this);
  anon_unknown_0::float_
            ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)local_50,sVar4);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._32_1_ == '\x01') {
    fVar3 = (float)(double)CONCAT71(result.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                                    ._M_payload._25_7_,
                                    result.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                                    ._M_payload._M_value.nanPayload.
                                    super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_long>._M_engaged);
    if (NAN(fVar3)) {
      uVar1 = 
      "8__detail9__variant12__gen_vtableIvOZNS0_16_Variant_storageILb0EJN4wasm22PossibleConstantValuesEPNS3_10ExpressionEEE8_M_resetEvEUlOT_E_JRSt7variantIJS4_S6_EEEE9_S_vtableE"
      ;
      if ((result.
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
           _M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
           _M_payload._16_1_ == '\x01') &&
         (uVar1 = result.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                  ._M_payload._M_value.super_LexResult.span._M_str,
         (char *)((long)&__DT_JMPREL[0x332c].r_addend + 7) <=
         result.
         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
         _M_payload.
         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
         _M_payload._M_value.super_LexResult.span._M_str + -1)) {
        uVar2 = 0;
        goto LAB_00c0216c;
      }
      fVar3 = (float)((uint)uVar1 | (uint)fVar3 & 0xff800000);
    }
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = fVar3;
    uVar2 = 0x100000000;
    this->pos = this->pos + (long)local_50;
    advance(this);
    goto LAB_00c0216c;
  }
  sVar4 = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_50,sVar4);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._M_value.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != true) {
    uVar2 = 0;
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = extraout_XMM0_Da;
    goto LAB_00c0216c;
  }
  this->pos = this->pos + (long)local_50;
  advance(this);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._16_4_ == 2) {
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
        _M_payload._M_value.super_LexResult.span._M_str == (char *)0x0) {
      result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>._44_4_ =
           -0.0;
    }
    else {
LAB_00c02146:
      result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>._44_4_ =
           (BADTYPE)(long)result.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                          ._M_payload._M_value.super_LexResult.span._M_str;
    }
  }
  else {
    if (-1 < (long)result.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                   ._M_payload._M_value.super_LexResult.span._M_str) goto LAB_00c02146;
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = (BADTYPE)result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                      ._M_payload._8_8_;
  }
  uVar2 = 0x100000000;
LAB_00c0216c:
  return (optional<float>)
         ((uint)result.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                ._44_4_ | uVar2);
}

Assistant:

std::optional<float> Lexer::takeF32() {
  constexpr int signif = 23;
  constexpr uint32_t payloadMask = (1u << signif) - 1;
  constexpr uint64_t nanDefault = 1ull << (signif - 1);
  if (auto result = float_(next())) {
    float f = result->d;
    if (std::isnan(f)) {
      // Validate and inject payload.
      uint64_t payload = result->nanPayload ? *result->nanPayload : nanDefault;
      if (payload == 0 || payload > payloadMask) {
        // TODO: Add error production for out-of-bounds payload.
        return std::nullopt;
      }
      uint32_t bits;
      static_assert(sizeof(bits) == sizeof(f));
      memcpy(&bits, &f, sizeof(bits));
      bits = (bits & ~payloadMask) | payload;
      memcpy(&f, &bits, sizeof(bits));
    }
    pos += result->span.size();
    advance();
    return f;
  }
  if (auto result = integer(next())) {
    pos += result->span.size();
    advance();
    if (result->sign == Neg) {
      if (result->n == 0) {
        return -0.0f;
      }
      return float(int64_t(result->n));
    }
    return float(result->n);
  }
  return std::nullopt;
}